

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CallErrorHandler(SQVM *this,SQObjectPtr *error)

{
  undefined1 local_28 [8];
  SQObjectPtr out;
  SQObjectPtr *error_local;
  SQVM *this_local;
  
  if ((this->_errorhandler).super_SQObject._type != OT_NULL) {
    out.super_SQObject._unVal = (SQObjectValue)error;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_28);
    Push(this,&this->_roottable);
    Push(this,(SQObjectPtr *)out.super_SQObject._unVal.pTable);
    Call(this,&this->_errorhandler,2,this->_top + -2,(SQObjectPtr *)local_28,0);
    Pop(this,2);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_28);
  }
  return;
}

Assistant:

void SQVM::CallErrorHandler(SQObjectPtr &error)
{
    if(type(_errorhandler) != OT_NULL) {
        SQObjectPtr out;
        Push(_roottable); Push(error);
        Call(_errorhandler, 2, _top-2, out,SQFalse);
        Pop(2);
    }
}